

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_xlsxio_write.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  time_t tVar3;
  long lVar4;
  
  lVar2 = xlsxiowrite_open(filename,"MySheet");
  if (lVar2 == 0) {
    main_cold_1();
    iVar1 = 1;
  }
  else {
    xlsxiowrite_set_row_height(lVar2,1);
    xlsxiowrite_set_detection_rows(lVar2,10);
    lVar4 = 0;
    xlsxiowrite_add_column(lVar2,"Col1",0);
    xlsxiowrite_add_column(lVar2,"Col2",0x15);
    xlsxiowrite_add_column(lVar2,"Col3",0);
    xlsxiowrite_add_column(lVar2,"Col4",2);
    xlsxiowrite_add_column(lVar2,"Col5",0);
    xlsxiowrite_add_column(lVar2,"Col6",0);
    xlsxiowrite_add_column(lVar2,"Col7",0);
    xlsxiowrite_next_row(lVar2);
    do {
      xlsxiowrite_add_cell_string(lVar2,"Test");
      xlsxiowrite_add_cell_string(lVar2,"A b  c   d    e     f\nnew line");
      xlsxiowrite_add_cell_string(lVar2,"&% <test> \"\'");
      xlsxiowrite_add_cell_string(lVar2,0);
      xlsxiowrite_add_cell_int(lVar2,lVar4);
      tVar3 = time((time_t *)0x0);
      xlsxiowrite_add_cell_datetime(lVar2,tVar3);
      xlsxiowrite_add_cell_float(0x400921fb4d12d84a,lVar2);
      xlsxiowrite_next_row(lVar2);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 1000);
    xlsxiowrite_close(lVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main (int argc, char* argv[])
{
  xlsxiowriter handle;
  //open .xlsx file for writing (will overwrite if it already exists)
  if ((handle = xlsxiowrite_open(filename, "MySheet")) == NULL) {
    fprintf(stderr, "Error creating .xlsx file\n");
    return 1;
  }
  //set row height
  xlsxiowrite_set_row_height(handle, 1);
  //how many rows to buffer to detect column widths
  xlsxiowrite_set_detection_rows(handle, 10);
  //write column names
  xlsxiowrite_add_column(handle, "Col1", 0);
  xlsxiowrite_add_column(handle, "Col2", 21);
  xlsxiowrite_add_column(handle, "Col3", 0);
  xlsxiowrite_add_column(handle, "Col4", 2);
  xlsxiowrite_add_column(handle, "Col5", 0);
  xlsxiowrite_add_column(handle, "Col6", 0);
  xlsxiowrite_add_column(handle, "Col7", 0);
  xlsxiowrite_next_row(handle);
  //write data
  int i;
  for (i = 0; i < 1000; i++) {
    xlsxiowrite_add_cell_string(handle, "Test");
    xlsxiowrite_add_cell_string(handle, "A b  c   d    e     f\nnew line");
    xlsxiowrite_add_cell_string(handle, "&% <test> \"'");
    xlsxiowrite_add_cell_string(handle, NULL);
    xlsxiowrite_add_cell_int(handle, i);
    xlsxiowrite_add_cell_datetime(handle, time(NULL));
    xlsxiowrite_add_cell_float(handle, 3.1415926);
    xlsxiowrite_next_row(handle);
  }
  //close .xlsx file
  xlsxiowrite_close(handle);
  return 0;
}